

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

t_iemgui * iemgui_new(_class *cls)

{
  int iVar1;
  int iVar2;
  t_iemgui *ptVar3;
  _glist *p_Var4;
  _iemgui_private *p_Var5;
  
  ptVar3 = (t_iemgui *)pd_new(cls);
  p_Var4 = canvas_getcurrent();
  iVar1 = p_Var4->gl_font;
  ptVar3->x_glist = p_Var4;
  p_Var5 = (_iemgui_private *)getbytes(0x40);
  ptVar3->x_private = p_Var5;
  ptVar3->x_draw = iemgui_draw;
  iVar2 = 4;
  if (4 < iVar1) {
    iVar2 = iVar1;
  }
  ptVar3->x_fontsize = iVar2;
  ptVar3->x_fsf = (t_iem_fstyle_flags)0x0;
  ptVar3->x_isa = (t_iem_init_symargs)0x0;
  ptVar3->x_fcol = 0;
  ptVar3->x_bcol = 0xfcfcfc;
  ptVar3->x_lcol = 0;
  return ptVar3;
}

Assistant:

t_iemgui *iemgui_new(t_class*cls)
{
    t_iemgui *x = (t_iemgui *)pd_new(cls);
    t_glist *cnv = canvas_getcurrent();
    int fs = cnv->gl_font;
    x->x_glist = cnv;
    x->x_private = (t_iemgui_private*)getbytes(sizeof(*x->x_private));
    x->x_draw = (t_iemfunptr)iemgui_draw;

    x->x_fontsize = (fs<4)?4:fs;
/*
    int fs = x->x_gui.x_fontsize;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
*/
    iem_inttosymargs(&x->x_isa, 0);
    iem_inttofstyle(&x->x_fsf, 0);

    x->x_bcol = 0xFCFCFC;
    x->x_fcol = 0x00;
    x->x_lcol = 0x00;

    return x;
}